

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  sqlite3 *db;
  sqlite3_xauth p_Var3;
  RenameToken *pRVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  RenameToken *pToken_1;
  char *pcVar8;
  char *zName;
  char *pcVar9;
  i64 iVar10;
  RenameToken *pRVar11;
  TriggerStep *pTVar12;
  RenameToken *pToken_2;
  FKey *pFVar13;
  RenameToken **ppRVar14;
  int iVar15;
  long lVar16;
  RenameToken *pRVar17;
  RenameToken *pToken_4;
  RenameToken *pRVar18;
  RenameToken *pToken;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  NameContext sNC;
  RenameCtx local_288;
  sqlite3_context *local_260;
  char *local_258;
  char *local_250;
  sqlite3_value **local_248;
  char *local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  local_240 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar8 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar9 = (char *)sqlite3ValueText(argv[5],'\x01');
  local_248 = argv;
  iVar10 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar9 == (char *)0x0 || (zName == (char *)0x0 || pcVar8 == (char *)0x0)) {
    return;
  }
  p_Var3 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  local_260 = context;
  local_258 = pcVar8;
  local_250 = pcVar9;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar8 = local_240;
  local_288.pTab = (Table *)0x0;
  local_288.zOld = (char *)0x0;
  local_288.pList = (RenameToken *)0x0;
  local_288.nList = 0;
  local_288.iCol = 0;
  local_288.pTab = sqlite3FindTable(db,zName,local_240);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = '\0';
  local_238._37_3_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_208;
  local_238.u.pNC = (NameContext *)&local_288;
  uVar6 = renameParseSql(&local_208,pcVar8,1,db,local_258,(int)iVar10);
  if (uVar6 == 0) {
    uVar6 = (uint)db->flags;
    if (local_208.pNewTable != (Table *)0x0) {
      if ((local_208.pNewTable)->pSelect == (Select *)0x0) {
        if ((((byte)(db->flags >> 0x1a) & 0x3f & (uVar6 >> 0xe & 1) == 0) == 0) &&
           (pFVar13 = (local_208.pNewTable)->pFKey, pFVar13 != (FKey *)0x0)) {
          pRVar11 = local_288.pList;
          iVar7 = local_288.nList;
          do {
            pcVar8 = pFVar13->zTo;
            if (pcVar8 != (char *)0x0) {
              lVar16 = 0;
              do {
                bVar1 = pcVar8[lVar16];
                bVar2 = zName[lVar16];
                bVar5 = bVar1 != bVar2;
                if (bVar1 == bVar2) {
                  if ((ulong)bVar1 == 0) goto LAB_001bf424;
                }
                else if (""[bVar1] != ""[bVar2]) goto LAB_001bf424;
                lVar16 = lVar16 + 1;
              } while( true );
            }
            bVar5 = true;
LAB_001bf424:
            pRVar17 = pRVar11;
            if (!(bool)(local_208.pRename == (RenameToken *)0x0 | bVar5)) {
              pRVar4 = local_208.pRename;
              pRVar17 = local_208.pRename;
              ppRVar14 = &local_208.pRename;
              if ((char *)(local_208.pRename)->p != pcVar8) {
                do {
                  pRVar18 = pRVar4;
                  pRVar4 = pRVar18->pNext;
                  pRVar17 = pRVar11;
                  if (pRVar4 == (RenameToken *)0x0) goto LAB_001bf46e;
                } while ((char *)pRVar4->p != pcVar8);
                ppRVar14 = &pRVar18->pNext;
                pRVar17 = pRVar4;
              }
              *ppRVar14 = pRVar17->pNext;
              pRVar17->pNext = pRVar11;
              iVar7 = iVar7 + 1;
              local_288.nList = iVar7;
              local_288.pList = pRVar17;
            }
LAB_001bf46e:
            pFVar13 = pFVar13->pNextFrom;
            pRVar11 = pRVar17;
          } while (pFVar13 != (FKey *)0x0);
        }
        if ((local_208.pNewTable)->zName != (char *)0x0) {
          lVar16 = 0;
          do {
            bVar1 = zName[lVar16];
            bVar2 = (local_208.pNewTable)->zName[lVar16];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_001bf506;
            }
            else if (""[bVar1] != ""[bVar2]) break;
            lVar16 = lVar16 + 1;
          } while( true );
        }
      }
      else if ((uVar6 >> 0x1a & 1) == 0) {
        local_68.pSrcList = (SrcList *)0x0;
        local_68.nRef = 0;
        local_68.nErr = 0;
        local_68.ncFlags = 0;
        local_68._44_4_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pParse = &local_208;
        sqlite3SelectPrep(&local_208,(local_208.pNewTable)->pSelect,&local_68);
        if (local_208.nErr != 0) {
          local_208.nErr = local_208.rc;
        }
        sqlite3WalkSelect(&local_238,(local_208.pNewTable)->pSelect);
        iVar7 = local_208.nErr;
        goto LAB_001bf20e;
      }
      iVar7 = 0;
      goto LAB_001bf20e;
    }
    if (local_208.pNewIndex != (Index *)0x0) {
      if (local_208.pRename != (RenameToken *)0x0) {
        if ((char *)(local_208.pRename)->p == (local_208.pNewIndex)->zName) {
          ppRVar14 = &local_208.pRename;
          pRVar11 = local_208.pRename;
        }
        else {
          do {
            pRVar11 = local_208.pRename;
            local_208.pRename = pRVar11->pNext;
            if (local_208.pRename == (RenameToken *)0x0) goto LAB_001bf581;
          } while ((char *)(local_208.pRename)->p != (local_208.pNewIndex)->zName);
          ppRVar14 = &pRVar11->pNext;
          pRVar11 = local_208.pRename;
        }
        *ppRVar14 = pRVar11->pNext;
        pRVar11->pNext = local_288.pList;
        local_288.nList = local_288.nList + 1;
        local_288.pList = pRVar11;
      }
LAB_001bf581:
      iVar7 = 0;
      if (((uVar6 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
        walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
      }
      goto LAB_001bf20e;
    }
    pcVar9 = (local_208.pNewTrigger)->table;
    if (pcVar9 != (char *)0x0) {
      lVar16 = 0;
      do {
        bVar1 = pcVar9[lVar16];
        if (bVar1 == zName[lVar16]) {
          if ((ulong)bVar1 == 0) goto LAB_001bf5b2;
        }
        else if (""[bVar1] != ""[(byte)zName[lVar16]]) break;
        lVar16 = lVar16 + 1;
      } while( true );
    }
    goto LAB_001bf63a;
  }
LAB_001bf206:
  pcVar9 = (char *)(ulong)uVar6;
  goto LAB_001bf209;
LAB_001bf6cf:
  if (local_208.pRename != (RenameToken *)0x0 && bVar1 == bVar2) {
    pRVar4 = local_208.pRename;
    pRVar17 = local_208.pRename;
    ppRVar14 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar8) {
      do {
        pRVar18 = pRVar4;
        pRVar4 = pRVar18->pNext;
        pRVar17 = pRVar11;
        if (pRVar4 == (RenameToken *)0x0) goto LAB_001bf720;
      } while ((char *)pRVar4->p != pcVar8);
      ppRVar14 = &pRVar18->pNext;
      pRVar17 = pRVar4;
    }
    *ppRVar14 = pRVar17->pNext;
    pRVar17->pNext = pRVar11;
    iVar15 = iVar15 + 1;
    local_288.nList = iVar15;
    local_288.pList = pRVar17;
  }
LAB_001bf720:
  pTVar12 = pTVar12->pNext;
  iVar7 = 0;
  pRVar11 = pRVar17;
  if (pTVar12 == (TriggerStep *)0x0) goto LAB_001bf20e;
  goto LAB_001bf69d;
LAB_001bf506:
  local_288.pTab = local_208.pNewTable;
  if ((uVar6 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
  }
  iVar7 = 0;
  if (local_208.pRename != (RenameToken *)0x0) {
    if ((char *)(local_208.pRename)->p == (local_208.pNewTable)->zName) {
      ppRVar14 = &local_208.pRename;
      pRVar11 = local_208.pRename;
    }
    else {
      do {
        pRVar11 = local_208.pRename;
        local_208.pRename = pRVar11->pNext;
        if (local_208.pRename == (RenameToken *)0x0) goto LAB_001bf20e;
      } while ((char *)(local_208.pRename)->p != (local_208.pNewTable)->zName);
      ppRVar14 = &pRVar11->pNext;
      pRVar11 = local_208.pRename;
    }
    *ppRVar14 = pRVar11->pNext;
    pRVar11->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar11;
    iVar7 = 0;
  }
  goto LAB_001bf20e;
LAB_001bf5b2:
  if (local_208.pRename != (RenameToken *)0x0 &&
      (local_288.pTab)->pSchema == (local_208.pNewTrigger)->pTabSchema) {
    pRVar11 = local_208.pRename;
    if ((char *)(local_208.pRename)->p == pcVar9) {
      ppRVar14 = &local_208.pRename;
    }
    else {
      do {
        pRVar17 = pRVar11;
        pRVar11 = pRVar17->pNext;
        if (pRVar11 == (RenameToken *)0x0) goto LAB_001bf63a;
      } while ((char *)pRVar11->p != pcVar9);
      ppRVar14 = &pRVar17->pNext;
    }
    *ppRVar14 = pRVar11->pNext;
    pRVar11->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar11;
  }
LAB_001bf63a:
  pcVar9 = (char *)0x0;
  iVar7 = 0;
  if ((uVar6 >> 0x1a & 1) == 0) {
    if ((int)iVar10 != 0) {
      pcVar8 = pcVar9;
    }
    uVar6 = renameResolveTrigger(&local_208,pcVar8);
    if (uVar6 == 0) {
      renameWalkTrigger(&local_238,local_208.pNewTrigger);
      pTVar12 = (local_208.pNewTrigger)->step_list;
      if (pTVar12 != (TriggerStep *)0x0) {
        pRVar11 = local_288.pList;
        iVar15 = local_288.nList;
LAB_001bf69d:
        pcVar8 = pTVar12->zTarget;
        pRVar17 = pRVar11;
        if (pcVar8 != (char *)0x0) {
          lVar16 = 0;
          do {
            bVar1 = pcVar8[lVar16];
            bVar2 = zName[lVar16];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_001bf6cf;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_001bf6cf;
            lVar16 = lVar16 + 1;
          } while( true );
        }
        goto LAB_001bf720;
      }
      goto LAB_001bf20e;
    }
    goto LAB_001bf206;
  }
LAB_001bf209:
  iVar7 = (int)pcVar9;
LAB_001bf20e:
  if (iVar7 == 0) {
    iVar7 = renameEditSql(local_260,&local_288,local_258,local_250,1);
  }
  if (iVar7 != 0) {
    if (local_208.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_260,iVar7);
    }
    else {
      renameColumnParseError(local_260,0,local_248[1],local_248[2],&local_208);
    }
  }
  renameParseCleanup(&local_208);
  pRVar11 = local_288.pList;
  while (pRVar11 != (RenameToken *)0x0) {
    pRVar17 = pRVar11->pNext;
    sqlite3DbFreeNN(db,pRVar11);
    pRVar11 = pRVar17;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = p_Var3;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}